

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  undefined1 auVar1 [64];
  bool bVar2;
  result_type rVar3;
  ostream *poVar4;
  int *piVar5;
  Stats *pSVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Stats stats;
  Iterator it_3;
  int num_duplicates;
  int new_payload_1;
  int new_key_1;
  int i_3;
  Iterator it;
  Iterator it_2;
  Iterator it_1;
  int num_entries;
  int i_2;
  int new_payload;
  int new_key;
  int i_1;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> index;
  int i;
  uniform_int_distribution<int> dis;
  mt19937_64 gen;
  pair<int,_int> values [100];
  int num_keys;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffdb68;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  *in_stack_ffffffffffffdb70;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffdb78;
  undefined8 in_stack_ffffffffffffdb80;
  Iterator *in_stack_ffffffffffffdb88;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffdb90;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffdb98;
  undefined7 in_stack_ffffffffffffdba0;
  undefined1 in_stack_ffffffffffffdba7;
  undefined4 in_stack_ffffffffffffdbb0;
  int in_stack_ffffffffffffdbb4;
  V *in_stack_ffffffffffffdbb8;
  undefined6 in_stack_ffffffffffffdbc0;
  undefined1 in_stack_ffffffffffffdbc6;
  undefined1 in_stack_ffffffffffffdbc7;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffdbe0;
  pair<int,_int> *local_23d0;
  int local_23c8;
  longlong lStack_2370;
  Iterator local_2330 [2];
  undefined4 local_22fc;
  undefined4 local_22dc;
  int local_22bc;
  int *in_stack_ffffffffffffdd48;
  int *in_stack_ffffffffffffdd50;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_ffffffffffffdd58;
  int local_228c;
  Iterator local_2250 [2];
  undefined4 local_221c;
  undefined4 local_21fc;
  int local_2198;
  int local_2194;
  result_type local_216c;
  int local_2168;
  int local_2164;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> local_2160;
  int local_20a0;
  pair<int,_int> local_338 [100];
  pair<int,_int> apStack_18 [2];
  int local_4;
  
  local_4 = 0;
  apStack_18[0].second = 100;
  local_23d0 = local_338;
  do {
    std::pair<int,_int>::pair<int,_int,_true>(local_23d0);
    local_23d0 = local_23d0 + 1;
  } while (local_23d0 != apStack_18);
  std::random_device::random_device
            ((random_device *)CONCAT44(in_stack_ffffffffffffdbb4,in_stack_ffffffffffffdbb0));
  std::random_device::operator()((random_device *)0x102446);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            (in_stack_ffffffffffffdb70,(result_type_conflict)in_stack_ffffffffffffdb68);
  std::random_device::~random_device((random_device *)0x102476);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)0x102483);
  for (local_20a0 = 0; local_20a0 < 100; local_20a0 = local_20a0 + 1) {
    local_338[local_20a0].first = local_20a0;
    rVar3 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)in_stack_ffffffffffffdb70,
                       in_stack_ffffffffffffdb68);
    local_338[local_20a0].second = rVar3;
  }
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Alex
            ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             CONCAT17(in_stack_ffffffffffffdba7,in_stack_ffffffffffffdba0));
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
            ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
             CONCAT17(in_stack_ffffffffffffdbc7,
                      CONCAT16(in_stack_ffffffffffffdbc6,in_stack_ffffffffffffdbc0)),
             in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb4);
  for (local_2164 = 100; local_2164 < 200; local_2164 = local_2164 + 1) {
    local_2168 = local_2164;
    local_216c = std::uniform_int_distribution<int>::operator()
                           ((uniform_int_distribution<int> *)in_stack_ffffffffffffdb70,
                            in_stack_ffffffffffffdb68);
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::insert
              (in_stack_ffffffffffffdd58,in_stack_ffffffffffffdd50,in_stack_ffffffffffffdd48);
  }
  for (local_2194 = 0; local_2194 < 10; local_2194 = local_2194 + 1) {
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::erase
              (in_stack_ffffffffffffdb90,(int *)in_stack_ffffffffffffdb88);
  }
  local_2198 = 0;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::begin
            (in_stack_ffffffffffffdb78);
  while( true ) {
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::end
              (in_stack_ffffffffffffdb78);
    bVar2 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
            Iterator::operator!=
                      ((Iterator *)in_stack_ffffffffffffdb70,(Iterator *)in_stack_ffffffffffffdb68);
    if (!bVar2) break;
    piVar5 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             Iterator::key((Iterator *)0x1026b0);
    if (*piVar5 % 2 == 0) {
      rVar3 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)in_stack_ffffffffffffdb70,
                         in_stack_ffffffffffffdb68);
      piVar5 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
               Iterator::payload((Iterator *)0x1026fc);
      *piVar5 = rVar3;
    }
    local_2198 = local_2198 + 1;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++(in_stack_ffffffffffffdb88,(int)((ulong)in_stack_ffffffffffffdb80 >> 0x20));
  }
  if (local_2198 != 0xbe) {
    in_stack_ffffffffffffdbe0 =
         (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
         std::operator<<((ostream *)&std::cout,"Error! There should be 190 entries in the index.");
    std::ostream::operator<<
              ((ostream *)in_stack_ffffffffffffdbe0,std::endl<char,std::char_traits<char>>);
  }
  local_2198 = 0;
  local_21fc = 0x32;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (in_stack_ffffffffffffdb98,(int *)in_stack_ffffffffffffdb90);
  while( true ) {
    local_221c = 100;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
              (in_stack_ffffffffffffdb98,(int *)in_stack_ffffffffffffdb90);
    bVar2 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
            Iterator::operator!=
                      ((Iterator *)in_stack_ffffffffffffdb70,(Iterator *)in_stack_ffffffffffffdb68);
    if (!bVar2) break;
    local_2198 = local_2198 + 1;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++(in_stack_ffffffffffffdb88,(int)((ulong)in_stack_ffffffffffffdb80 >> 0x20));
  }
  if (local_2198 != 0x32) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Error! There should be 50 entries with keys in the range [50, 100).");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_2198 = 0;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (in_stack_ffffffffffffdb98,(int *)in_stack_ffffffffffffdb90);
  while( true ) {
    piVar5 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             Iterator::key((Iterator *)0x1028b1);
    bVar2 = false;
    if (*piVar5 < 100) {
      alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::end
                (in_stack_ffffffffffffdb78);
      bVar2 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
              Iterator::operator!=
                        ((Iterator *)in_stack_ffffffffffffdb70,(Iterator *)in_stack_ffffffffffffdb68
                        );
    }
    if (bVar2 == false) break;
    local_2198 = local_2198 + 1;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++(in_stack_ffffffffffffdb88,(int)((ulong)in_stack_ffffffffffffdb80 >> 0x20));
  }
  if (local_2198 != 0x32) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Error! There should be 50 entries with keys in the range [50, 100).");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  for (local_228c = 0; local_228c < 9; local_228c = local_228c + 1) {
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)in_stack_ffffffffffffdb70,in_stack_ffffffffffffdb68)
    ;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::insert
              (in_stack_ffffffffffffdd58,in_stack_ffffffffffffdd50,in_stack_ffffffffffffdd48);
  }
  local_22bc = 0;
  local_22dc = 0x2a;
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::lower_bound
            (in_stack_ffffffffffffdb98,(int *)in_stack_ffffffffffffdb90);
  while( true ) {
    local_22fc = 0x2a;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::upper_bound
              (in_stack_ffffffffffffdb98,(int *)in_stack_ffffffffffffdb90);
    bVar2 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
            Iterator::operator!=
                      ((Iterator *)in_stack_ffffffffffffdb70,(Iterator *)in_stack_ffffffffffffdb68);
    if (!bVar2) break;
    local_22bc = local_22bc + 1;
    alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
    operator++(in_stack_ffffffffffffdb88,(int)((ulong)in_stack_ffffffffffffdb80 >> 0x20));
  }
  if (local_22bc != 10) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Error! There should be 10 entries with key of value 42.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::find
            (in_stack_ffffffffffffdb98,(int *)in_stack_ffffffffffffdb90);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::Iterator::
  operator=(local_2250,local_2330);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::end
            (in_stack_ffffffffffffdb78);
  bVar2 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
          Iterator::operator!=
                    ((Iterator *)in_stack_ffffffffffffdb70,(Iterator *)in_stack_ffffffffffffdb68);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error! Key with value 1337 should not exist.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  pSVar6 = alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
           get_stats(&local_2160);
  auVar8._0_4_ = pSVar6->num_keys;
  auVar8._4_4_ = pSVar6->num_model_nodes;
  auVar8._8_4_ = pSVar6->num_data_nodes;
  auVar8._12_4_ = pSVar6->num_expand_and_scales;
  auVar8._16_4_ = pSVar6->num_expand_and_retrains;
  auVar8._20_4_ = pSVar6->num_downward_splits;
  auVar8._24_4_ = pSVar6->num_sideways_splits;
  auVar8._28_4_ = pSVar6->num_model_node_expansions;
  auVar8._32_4_ = pSVar6->num_model_node_splits;
  auVar8._36_4_ = *(undefined4 *)&pSVar6->field_0x24;
  auVar8._40_8_ = pSVar6->num_downward_split_keys;
  auVar8._48_8_ = pSVar6->num_sideways_split_keys;
  auVar8._56_8_ = pSVar6->num_model_node_expansion_pointers;
  auVar7 = vmovdqu64_avx512f(auVar8);
  auVar1._0_8_ = pSVar6->num_sideways_split_keys;
  auVar1._8_8_ = pSVar6->num_model_node_expansion_pointers;
  auVar1._16_8_ = pSVar6->num_model_node_split_pointers;
  auVar1._24_8_ = pSVar6->num_node_lookups;
  auVar1._32_8_ = pSVar6->num_lookups;
  auVar1._40_8_ = pSVar6->num_inserts;
  auVar1._48_8_ = pSVar6->splitting_time;
  auVar1._56_8_ = pSVar6->cost_computation_time;
  auVar8 = vmovdqu64_avx512f(auVar1);
  auVar8 = vmovdqu64_avx512f(auVar8);
  lStack_2370 = auVar8._40_8_;
  auVar8 = vmovdqu64_avx512f(auVar7);
  local_23c8 = auVar8._0_4_;
  poVar4 = std::operator<<((ostream *)&std::cout,"Final num keys: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_23c8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Num inserts: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lStack_2370);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::~Alex
            (in_stack_ffffffffffffdbe0);
  return local_4;
}

Assistant:

int main(int, char**) {
  // Create some synthetic data: keys are dense integers between 0 and 99, and
  // payloads are random values
  const int num_keys = 100;
  std::pair<KEY_TYPE, PAYLOAD_TYPE> values[num_keys];
  std::mt19937_64 gen(std::random_device{}());
  std::uniform_int_distribution<PAYLOAD_TYPE> dis;
  for (int i = 0; i < num_keys; i++) {
    values[i].first = i;
    values[i].second = dis(gen);
  }

  alex::Alex<KEY_TYPE, PAYLOAD_TYPE> index;

  // Bulk load the keys [0, 100)
  index.bulk_load(values, num_keys);

  // Insert the keys [100, 200). Now there are 200 keys.
  for (int i = num_keys; i < 2 * num_keys; i++) {
    KEY_TYPE new_key = i;
    PAYLOAD_TYPE new_payload = dis(gen);
    index.insert(new_key, new_payload);
  }

  // Erase the keys [0, 10). Now there are 190 keys.
  for (int i = 0; i < 10; i++) {
    index.erase(i);
  }

  // Iterate through all entries in the index and update their payload if the
  // key is even
  int num_entries = 0;
  for (auto it = index.begin(); it != index.end(); it++) {
    if (it.key() % 2 == 0) {  // it.key() is equivalent to (*it).first
      it.payload() = dis(gen);
    }
    num_entries++;
  }
  if (num_entries != 190) {
    std::cout << "Error! There should be 190 entries in the index."
              << std::endl;
  }

  // Iterate through all entries with keys between 50 (inclusive) and 100
  // (exclusive)
  num_entries = 0;
  for (auto it = index.lower_bound(50); it != index.lower_bound(100); it++) {
    num_entries++;
  }
  if (num_entries != 50) {
    std::cout
        << "Error! There should be 50 entries with keys in the range [50, 100)."
        << std::endl;
  }

  // Equivalent way of iterating through all entries with keys between 50
  // (inclusive) and 100 (exclusive)
  num_entries = 0;
  auto it = index.lower_bound(50);
  while (it.key() < 100 && it != index.end()) {
    num_entries++;
    it++;
  }
  if (num_entries != 50) {
    std::cout
        << "Error! There should be 50 entries with keys in the range [50, 100)."
        << std::endl;
  }

  // Insert 9 more keys with value 42. Now there are 199 keys.
  for (int i = 0; i < 9; i++) {
    KEY_TYPE new_key = 42;
    PAYLOAD_TYPE new_payload = dis(gen);
    index.insert(new_key, new_payload);
  }

  // Iterate through all 10 entries with keys of value 42
  int num_duplicates = 0;
  for (auto it = index.lower_bound(42); it != index.upper_bound(42); it++) {
    num_duplicates++;
  }
  if (num_duplicates != 10) {
    std::cout << "Error! There should be 10 entries with key of value 42."
              << std::endl;
  }

  // Check if a non-existent key exists
  it = index.find(1337);
  if (it != index.end()) {
    std::cout << "Error! Key with value 1337 should not exist." << std::endl;
  }

  // Look at some stats
  auto stats = index.get_stats();
  std::cout << "Final num keys: " << stats.num_keys
            << std::endl;  // expected: 199
  std::cout << "Num inserts: " << stats.num_inserts
            << std::endl;  // expected: 109
}